

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_utils.cpp
# Opt level: O0

char16_t *
icu_63::number::impl::utils::getPatternForStyle
          (Locale *locale,char *nsName,CldrPatternStyle style,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  char *localeID;
  UResourceBundle *pUVar3;
  Locale *local_60;
  char16_t *pattern;
  undefined4 local_50;
  UErrorCode localStatus;
  LocalPointerBase<UResourceBundle> local_40;
  LocalUResourceBundlePointer res;
  char *patternKey;
  UErrorCode *status_local;
  CldrPatternStyle style_local;
  char *nsName_local;
  Locale *locale_local;
  
  switch(style) {
  case CLDR_PATTERN_STYLE_DECIMAL:
    res.super_LocalPointerBase<UResourceBundle>.ptr =
         (LocalPointerBase<UResourceBundle>)((long)"/decimalFormat" + 1);
    break;
  case CLDR_PATTERN_STYLE_CURRENCY:
    res.super_LocalPointerBase<UResourceBundle>.ptr =
         (LocalPointerBase<UResourceBundle>)((long)"/currencyFormat" + 1);
    break;
  case CLDR_PATTERN_STYLE_ACCOUNTING:
    res.super_LocalPointerBase<UResourceBundle>.ptr =
         (LocalPointerBase<UResourceBundle>)anon_var_dwarf_8e1e0;
    break;
  case CLDR_PATTERN_STYLE_PERCENT:
    res.super_LocalPointerBase<UResourceBundle>.ptr =
         (LocalPointerBase<UResourceBundle>)anon_var_dwarf_8e1f6;
    break;
  case CLDR_PATTERN_STYLE_SCIENTIFIC:
    res.super_LocalPointerBase<UResourceBundle>.ptr =
         (LocalPointerBase<UResourceBundle>)anon_var_dwarf_8e200;
    break;
  default:
    res.super_LocalPointerBase<UResourceBundle>.ptr =
         (LocalPointerBase<UResourceBundle>)((long)"/decimalFormat" + 1);
  }
  localeID = Locale::getName(locale);
  pUVar3 = ures_open_63((char *)0x0,localeID,status);
  LocalUResourceBundlePointer::LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_40,pUVar3);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    pattern._4_4_ = U_ZERO_ERROR;
    pUVar3 = LocalPointerBase<UResourceBundle>::getAlias(&local_40);
    local_60 = (Locale *)
               anon_unknown.dwarf_8f5aa::doGetPattern
                         (pUVar3,nsName,(char *)res.super_LocalPointerBase<UResourceBundle>.ptr,
                          status,(UErrorCode *)((long)&pattern + 4));
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      UVar1 = ::U_FAILURE(pattern._4_4_);
      if ((UVar1 != '\0') && (iVar2 = strcmp("latn",nsName), iVar2 != 0)) {
        pattern._4_4_ = U_ZERO_ERROR;
        pUVar3 = LocalPointerBase<UResourceBundle>::getAlias(&local_40);
        local_60 = (Locale *)
                   anon_unknown.dwarf_8f5aa::doGetPattern
                             (pUVar3,"latn",(char *)res.super_LocalPointerBase<UResourceBundle>.ptr,
                              status,(UErrorCode *)((long)&pattern + 4));
        UVar1 = ::U_FAILURE(*status);
        if (UVar1 != '\0') {
          locale_local = (Locale *)0x42c4ec;
          goto LAB_0026ff2a;
        }
      }
      locale_local = local_60;
    }
    else {
      locale_local = (Locale *)0x42c4ec;
    }
  }
  else {
    locale_local = (Locale *)0x42c4ec;
  }
LAB_0026ff2a:
  local_50 = 1;
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_40);
  return (char16_t *)locale_local;
}

Assistant:

const char16_t* utils::getPatternForStyle(const Locale& locale, const char* nsName, CldrPatternStyle style,
                                          UErrorCode& status) {
    const char* patternKey;
    switch (style) {
        case CLDR_PATTERN_STYLE_DECIMAL:
            patternKey = "decimalFormat";
            break;
        case CLDR_PATTERN_STYLE_CURRENCY:
            patternKey = "currencyFormat";
            break;
        case CLDR_PATTERN_STYLE_ACCOUNTING:
            patternKey = "accountingFormat";
            break;
        case CLDR_PATTERN_STYLE_PERCENT:
            patternKey = "percentFormat";
            break;
        case CLDR_PATTERN_STYLE_SCIENTIFIC:
            patternKey = "scientificFormat";
            break;
        default:
            patternKey = "decimalFormat"; // silence compiler error
            U_ASSERT(false);
    }
    LocalUResourceBundlePointer res(ures_open(nullptr, locale.getName(), &status));
    if (U_FAILURE(status)) { return u""; }

    // Attempt to get the pattern with the native numbering system.
    UErrorCode localStatus = U_ZERO_ERROR;
    const char16_t* pattern;
    pattern = doGetPattern(res.getAlias(), nsName, patternKey, status, localStatus);
    if (U_FAILURE(status)) { return u""; }

    // Fall back to latn if native numbering system does not have the right pattern
    if (U_FAILURE(localStatus) && uprv_strcmp("latn", nsName) != 0) {
        localStatus = U_ZERO_ERROR;
        pattern = doGetPattern(res.getAlias(), "latn", patternKey, status, localStatus);
        if (U_FAILURE(status)) { return u""; }
    }

    return pattern;
}